

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Split_inl.hpp
# Opt level: O2

bool CLI::detail::split_long(string *current,string *name,string *value)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  string asStack_48 [32];
  
  if (2 < current->_M_string_length) {
    iVar2 = ::std::__cxx11::string::compare((ulong)current,0,(char *)0x2);
    if (iVar2 != 0) {
      return false;
    }
    bVar1 = (current->_M_dataplus)._M_p[2];
    if (0x21 < bVar1 && bVar1 != 0x2d) {
      lVar3 = ::std::__cxx11::string::find((char)current,0x3d);
      if (lVar3 == -1) {
        ::std::__cxx11::string::substr((ulong)asStack_48,(ulong)current);
        ::std::__cxx11::string::operator=((string *)name,asStack_48);
        ::std::__cxx11::string::~string(asStack_48);
        ::std::__cxx11::string::assign((char *)value);
      }
      else {
        ::std::__cxx11::string::substr((ulong)asStack_48,(ulong)current);
        ::std::__cxx11::string::operator=((string *)name,asStack_48);
        ::std::__cxx11::string::~string(asStack_48);
        ::std::__cxx11::string::substr((ulong)asStack_48,(ulong)current);
        ::std::__cxx11::string::operator=((string *)value,asStack_48);
        ::std::__cxx11::string::~string(asStack_48);
      }
      return true;
    }
  }
  return false;
}

Assistant:

CLI11_INLINE bool split_long(const std::string &current, std::string &name, std::string &value) {
    if(current.size() > 2 && current.compare(0, 2, "--") == 0 && valid_first_char(current[2])) {
        auto loc = current.find_first_of('=');
        if(loc != std::string::npos) {
            name = current.substr(2, loc - 2);
            value = current.substr(loc + 1);
        } else {
            name = current.substr(2);
            value = "";
        }
        return true;
    }
    return false;
}